

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O2

string_t duckdb::Varint::InitializeVarintZero(Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  anon_union_16_2_67f50693_for_value local_18;
  
  local_18._0_8_ = 0x1008000000004;
  string_t::Finalize((string_t *)&local_18.pointer);
  aVar1.pointer.ptr = local_18.pointer.ptr;
  aVar1._0_8_ = local_18._0_8_;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

string_t Varint::InitializeVarintZero(Vector &result) {
	uint32_t blob_size = 1 + VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	SetHeader(writable_blob, 1, false);
	writable_blob[3] = 0;
	blob.Finalize();
	return blob;
}